

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_multi_member_reference_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,
          SmallVector<unsigned_int,_8UL> *indices)

{
  uint32_t id;
  TypedID *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string local_98;
  string local_78;
  uint *local_58;
  uint *index;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  SPIRType *member_type;
  SmallVector<unsigned_int,_8UL> *local_28;
  SmallVector<unsigned_int,_8UL> *indices_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *ret;
  
  member_type._7_1_ = 0;
  local_28 = indices;
  indices_local = (SmallVector<unsigned_int,_8UL> *)type;
  type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  __range1 = indices_local;
  __begin1 = (uint *)local_28;
  __end1 = VectorView<unsigned_int>::begin(&local_28->super_VectorView<unsigned_int>);
  index = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin1);
  for (; __end1 != index; __end1 = __end1 + 1) {
    local_58 = __end1;
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)*__end1;
    to_member_name_abi_cxx11_(&local_98,this,(SPIRType *)__range1,*__end1);
    join<char_const(&)[2],std::__cxx11::string>
              (&local_78,(spirv_cross *)0x4aff3f,(char (*) [2])&local_98,ts_1);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         &__range1[2].stack_storage,(ulong)*local_58);
    id = TypedID::operator_cast_to_unsigned_int(this_00);
    __range1 = (SmallVector<unsigned_int,_8UL> *)
               Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_multi_member_reference(const SPIRType &type, const SmallVector<uint32_t> &indices)
{
	string ret;
	auto *member_type = &type;
	for (auto &index : indices)
	{
		ret += join(".", to_member_name(*member_type, index));
		member_type = &get<SPIRType>(member_type->member_types[index]);
	}
	return ret;
}